

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

ExtPubkey * __thiscall
cfd::core::HDWallet::GeneratePubkey
          (ExtPubkey *__return_storage_ptr__,HDWallet *this,NetType network_type,
          Bip32FormatType format_type)

{
  ExtPrivkey privkey;
  Extkey local_a0;
  
  Extkey::Extkey(&local_a0,&this->seed_,network_type,format_type);
  ExtPrivkey::GetExtPubkey(__return_storage_ptr__,(ExtPrivkey *)&local_a0);
  Extkey::~Extkey(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey HDWallet::GeneratePubkey(
    NetType network_type, Bip32FormatType format_type) const {
  ExtPrivkey privkey(seed_, network_type, format_type);
  return privkey.GetExtPubkey();
}